

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MS3DImporter::ReadComments<Assimp::MS3DImporter::TempJoint>
          (MS3DImporter *this,StreamReaderLE *stream,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *outp)

{
  uint uVar1;
  uint uVar2;
  StreamReader<false,_false> *this_00;
  ulong uVar3;
  size_type sVar4;
  Logger *this_01;
  DeadlyImportError *this_02;
  int8_t *piVar5;
  reference pvVar6;
  allocator local_89;
  string local_88 [35];
  undefined1 local_65;
  allocator local_51;
  string local_50;
  uint local_30;
  uint local_2c;
  uint32_t clength;
  uint32_t index;
  uint i;
  uint16_t cnt;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
  *outp_local;
  StreamReaderLE *stream_local;
  MS3DImporter *this_local;
  
  _i = outp;
  outp_local = (vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                *)stream;
  stream_local = (StreamReaderLE *)this;
  StreamReader<false,false>::operator>>
            ((StreamReader<false,false> *)stream,(unsigned_short *)((long)&index + 2));
  clength = 0;
  do {
    if (index._2_2_ <= clength) {
      return;
    }
    this_00 = StreamReader<false,false>::operator>>
                        ((StreamReader<false,false> *)outp_local,&local_2c);
    StreamReader<false,false>::operator>>((StreamReader<false,false> *)this_00,&local_30);
    uVar3 = (ulong)local_2c;
    sVar4 = std::
            vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
            ::size(_i);
    uVar1 = local_30;
    if (uVar3 < sVar4) {
      uVar2 = StreamReader<false,_false>::GetRemainingSize((StreamReader<false,_false> *)outp_local)
      ;
      if (uVar2 < uVar1) {
        local_65 = 1;
        this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_50,"MS3D: Failure reading comment, length field is out of range"
                   ,&local_51);
        DeadlyImportError::DeadlyImportError(this_02,&local_50);
        local_65 = 0;
        __cxa_throw(this_02,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      piVar5 = StreamReader<false,_false>::GetPtr((StreamReader<false,_false> *)outp_local);
      uVar3 = (ulong)local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,piVar5,uVar3,&local_89);
      pvVar6 = std::
               vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ::operator[](_i,(ulong)local_2c);
      std::__cxx11::string::operator=((string *)&pvVar6->comment,local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    else {
      this_01 = DefaultLogger::get();
      Logger::warn(this_01,"MS3D: Invalid index in comment section");
    }
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)outp_local,(ulong)local_30);
    clength = clength + 1;
  } while( true );
}

Assistant:

void MS3DImporter :: ReadComments(StreamReaderLE& stream, std::vector<T>& outp)
{
    uint16_t cnt;
    stream >> cnt;

    for(unsigned int i = 0; i < cnt; ++i) {
        uint32_t index, clength;
        stream >> index >> clength;

        if(index >= outp.size()) {
            ASSIMP_LOG_WARN("MS3D: Invalid index in comment section");
        }
        else if (clength > stream.GetRemainingSize()) {
            throw DeadlyImportError("MS3D: Failure reading comment, length field is out of range");
        }
        else {
            outp[index].comment = std::string(reinterpret_cast<char*>(stream.GetPtr()),clength);
        }
        stream.IncPtr(clength);
    }
}